

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode SecureChannelHandshake(UA_Client *client,UA_Boolean renew)

{
  long lVar1;
  UA_Logger p_Var2;
  UA_Byte *pUVar3;
  UA_Boolean UVar4;
  UA_StatusCode UVar5;
  UA_StatusCode UVar6;
  UA_StatusCode UVar7;
  UA_StatusCode UVar8;
  UA_StatusCode UVar9;
  UA_DateTime UVar10;
  char *pcVar11;
  UA_String UVar12;
  undefined1 local_238 [8];
  UA_OpenSecureChannelResponse response;
  UA_NodeId expectedRequest;
  undefined1 auStack_160 [7];
  UA_Boolean realloced;
  UA_ByteString reply;
  UA_SecureConversationMessageHeader messageHeader;
  UA_OpenSecureChannelRequest opnSecRq;
  UA_NodeId requestType;
  UA_SequenceHeader seqHeader;
  UA_Byte *local_80;
  undefined1 local_78 [8];
  UA_AsymmetricAlgorithmSecurityHeader asymHeader;
  size_t offset;
  undefined1 auStack_38 [4];
  UA_StatusCode retval;
  UA_ByteString message;
  UA_Connection *conn;
  UA_Boolean renew_local;
  UA_Client *client_local;
  
  if ((renew) &&
     (lVar1 = client->nextChannelRenewal, UVar10 = UA_DateTime_nowMonotonic(), 0 < lVar1 - UVar10))
  {
    client_local._4_4_ = 0;
  }
  else {
    message.data = (UA_Byte *)&client->connection;
    if (((UA_Connection *)message.data)->state == UA_CONNECTION_ESTABLISHED) {
      client_local._4_4_ =
           (*(client->connection).getSendBuffer)
                     ((UA_Connection *)message.data,
                      (size_t)(client->connection).remoteConf.recvBufferSize,
                      (UA_ByteString *)auStack_38);
      if (client_local._4_4_ == 0) {
        asymHeader.receiverCertificateThumbprint.data = (UA_Byte *)0xc;
        UA_AsymmetricAlgorithmSecurityHeader_init((UA_AsymmetricAlgorithmSecurityHeader *)local_78);
        UVar12 = UA_STRING("http://opcfoundation.org/UA/SecurityPolicy#None");
        seqHeader = (UA_SequenceHeader)UVar12.length;
        local_78._0_4_ = seqHeader.sequenceNumber;
        local_78._4_4_ = seqHeader.requestId;
        local_80 = UVar12.data;
        asymHeader.securityPolicyUri.length = (size_t)local_80;
        UVar5 = UA_AsymmetricAlgorithmSecurityHeader_encodeBinary
                          ((UA_AsymmetricAlgorithmSecurityHeader *)local_78,
                           (UA_ByteString *)auStack_38,
                           (size_t *)&asymHeader.receiverCertificateThumbprint.data);
        requestType.identifier._8_4_ = (client->channel).sendSequenceNumber + 1;
        (client->channel).sendSequenceNumber = requestType.identifier._8_4_;
        requestType.identifier._12_4_ = client->requestId + 1;
        client->requestId = requestType.identifier._12_4_;
        UVar6 = UA_SequenceHeader_encodeBinary
                          ((UA_SequenceHeader *)&requestType.identifier.string.data,
                           (UA_ByteString *)auStack_38,
                           (size_t *)&asymHeader.receiverCertificateThumbprint.data);
        UA_NODEID_NUMERIC((UA_NodeId *)&opnSecRq.requestedLifetime,0,0x1be);
        UVar7 = UA_NodeId_encodeBinary
                          ((UA_NodeId *)&opnSecRq.requestedLifetime,(UA_ByteString *)auStack_38,
                           (size_t *)&asymHeader.receiverCertificateThumbprint.data);
        UA_OpenSecureChannelRequest_init
                  ((UA_OpenSecureChannelRequest *)&messageHeader.messageHeader.messageSize);
        opnSecRq.requestHeader.authenticationToken.identifier.string.data =
             (UA_Byte *)UA_DateTime_now();
        messageHeader._4_8_ = *(undefined8 *)&client->authenticationToken;
        opnSecRq.requestHeader.authenticationToken._0_8_ =
             *(undefined8 *)&(client->authenticationToken).identifier;
        opnSecRq.requestHeader.authenticationToken.identifier.string.length =
             *(size_t *)((long)&(client->authenticationToken).identifier + 8);
        if (renew) {
          opnSecRq.requestHeader.additionalHeader.content._36_4_ = 1;
          UA_LOG_DEBUG((client->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                       "Requesting to renew the SecureChannel");
        }
        else {
          opnSecRq.requestHeader.additionalHeader.content._36_4_ = 0;
          UA_LOG_DEBUG((client->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                       "Requesting to open a SecureChannel");
        }
        opnSecRq.clientProtocolVersion = 1;
        opnSecRq._120_8_ = (client->channel).clientNonce.length;
        opnSecRq.clientNonce.length = (size_t)(client->channel).clientNonce.data;
        opnSecRq.clientNonce.data._0_4_ = (client->config).secureChannelLifeTime;
        UVar8 = UA_OpenSecureChannelRequest_encodeBinary
                          ((UA_OpenSecureChannelRequest *)&messageHeader.messageHeader.messageSize,
                           (UA_ByteString *)auStack_38,
                           (size_t *)&asymHeader.receiverCertificateThumbprint.data);
        pUVar3 = asymHeader.receiverCertificateThumbprint.data;
        reply.data._4_4_ = 0x464e504f;
        if (renew) {
          messageHeader.messageHeader.messageTypeAndChunkType =
               (client->channel).securityToken.channelId;
        }
        else {
          messageHeader.messageHeader.messageTypeAndChunkType = 0;
        }
        asymHeader.receiverCertificateThumbprint.data = (UA_Byte *)0x0;
        UVar9 = UA_SecureConversationMessageHeader_encodeBinary
                          ((UA_SecureConversationMessageHeader *)((long)&reply.data + 4),
                           (UA_ByteString *)auStack_38,
                           (size_t *)&asymHeader.receiverCertificateThumbprint.data);
        client_local._4_4_ = UVar9 | UVar8 | UVar7 | UVar6 | UVar5;
        if (client_local._4_4_ == 0) {
          _auStack_38 = (ulong)pUVar3 & 0xffffffff;
          client_local._4_4_ = (**(code **)(message.data + 0x68))(message.data,auStack_38);
          if (client_local._4_4_ == 0) {
            _auStack_160 = 0;
            reply.length = (size_t)(UA_Byte *)0x0;
            expectedRequest.identifier.guid.data4[7] = '\0';
            client_local._4_4_ =
                 UA_Connection_receiveChunksBlocking
                           ((UA_Connection *)message.data,(UA_ByteString *)auStack_160,
                            (UA_Boolean *)(expectedRequest.identifier.guid.data4 + 7),
                            (client->config).timeout);
            if (client_local._4_4_ == 0) {
              asymHeader.receiverCertificateThumbprint.data = (UA_Byte *)0x0;
              UVar5 = UA_SecureConversationMessageHeader_decodeBinary
                                ((UA_ByteString *)auStack_160,
                                 (size_t *)&asymHeader.receiverCertificateThumbprint.data,
                                 (UA_SecureConversationMessageHeader *)((long)&reply.data + 4));
              UVar6 = UA_AsymmetricAlgorithmSecurityHeader_decodeBinary
                                ((UA_ByteString *)auStack_160,
                                 (size_t *)&asymHeader.receiverCertificateThumbprint.data,
                                 (UA_AsymmetricAlgorithmSecurityHeader *)local_78);
              UVar7 = UA_SequenceHeader_decodeBinary
                                ((UA_ByteString *)auStack_160,
                                 (size_t *)&asymHeader.receiverCertificateThumbprint.data,
                                 (UA_SequenceHeader *)&requestType.identifier.string.data);
              UVar8 = UA_NodeId_decodeBinary
                                ((UA_ByteString *)auStack_160,
                                 (size_t *)&asymHeader.receiverCertificateThumbprint.data,
                                 (UA_NodeId *)&opnSecRq.requestedLifetime);
              UA_NODEID_NUMERIC((UA_NodeId *)&response.serverNonce.data,0,0x1c1);
              if ((UVar8 == 0 && (UVar7 == 0 && (UVar6 == 0 && UVar5 == 0))) &&
                 (UVar4 = UA_NodeId_equal((UA_NodeId *)&opnSecRq.requestedLifetime,
                                          (UA_NodeId *)&response.serverNonce.data), UVar4)) {
                (client->channel).receiveSequenceNumber = requestType.identifier._8_4_;
                UVar5 = UA_OpenSecureChannelResponse_decodeBinary
                                  ((UA_ByteString *)auStack_160,
                                   (size_t *)&asymHeader.receiverCertificateThumbprint.data,
                                   (UA_OpenSecureChannelResponse *)local_238);
                if ((expectedRequest.identifier.guid.data4[7] & 1) == 0) {
                  (**(code **)(message.data + 0x78))(message.data,auStack_160);
                }
                else {
                  UA_ByteString_deleteMembers((UA_ByteString *)auStack_160);
                }
                client_local._4_4_ = response.responseHeader.timestamp._4_4_ | UVar5;
                if (client_local._4_4_ == 0) {
                  UVar10 = UA_DateTime_nowMonotonic();
                  client->nextChannelRenewal =
                       UVar10 + (long)((double)(uint)response.securityToken.createdAt * 10000.0 *
                                      0.75);
                  UA_ChannelSecurityToken_deleteMembers(&(client->channel).securityToken);
                  UA_ChannelSecurityToken_copy
                            ((UA_ChannelSecurityToken *)&response.serverProtocolVersion,
                             &(client->channel).securityToken);
                  UA_ByteString_deleteMembers(&(client->channel).serverNonce);
                  UA_ByteString_copy((UA_ByteString *)&response.securityToken.revisedLifetime,
                                     &(client->channel).serverNonce);
                  if (renew) {
                    UA_LOG_DEBUG((client->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                                 "SecureChannel renewed");
                  }
                  else {
                    UA_LOG_DEBUG((client->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                                 "SecureChannel opened");
                  }
                }
                else if (renew) {
                  p_Var2 = (client->config).logger;
                  pcVar11 = UA_StatusCode_name(client_local._4_4_);
                  UA_LOG_INFO(p_Var2,UA_LOGCATEGORY_SECURECHANNEL,
                              "SecureChannel could not be renewed with error code %s",pcVar11);
                }
                else {
                  p_Var2 = (client->config).logger;
                  pcVar11 = UA_StatusCode_name(client_local._4_4_);
                  UA_LOG_INFO(p_Var2,UA_LOGCATEGORY_SECURECHANNEL,
                              "SecureChannel could not be opened with error code %s",pcVar11);
                }
                UA_AsymmetricAlgorithmSecurityHeader_deleteMembers
                          ((UA_AsymmetricAlgorithmSecurityHeader *)local_78);
                UA_OpenSecureChannelResponse_deleteMembers
                          ((UA_OpenSecureChannelResponse *)local_238);
              }
              else {
                UA_ByteString_deleteMembers((UA_ByteString *)auStack_160);
                UA_AsymmetricAlgorithmSecurityHeader_deleteMembers
                          ((UA_AsymmetricAlgorithmSecurityHeader *)local_78);
                UA_NodeId_deleteMembers((UA_NodeId *)&opnSecRq.requestedLifetime);
                UA_LOG_DEBUG((client->config).logger,UA_LOGCATEGORY_CLIENT,
                             "Reply answers the wrong request. Expected OpenSecureChannelResponse.")
                ;
                client_local._4_4_ = 0x80020000;
              }
            }
            else {
              UA_LOG_DEBUG((client->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                           "Receiving OpenSecureChannelResponse failed");
            }
          }
        }
        else {
          (*(client->connection).releaseSendBuffer)(&client->connection,(UA_ByteString *)auStack_38)
          ;
        }
      }
    }
    else {
      client_local._4_4_ = 0x800d0000;
    }
  }
  return client_local._4_4_;
}

Assistant:

static UA_StatusCode
SecureChannelHandshake(UA_Client *client, UA_Boolean renew) {
    /* Check if sc is still valid */
    if(renew && client->nextChannelRenewal - UA_DateTime_nowMonotonic() > 0)
        return UA_STATUSCODE_GOOD;

    UA_Connection *conn = &client->connection;
    if(conn->state != UA_CONNECTION_ESTABLISHED)
        return UA_STATUSCODE_BADSERVERNOTCONNECTED;

    UA_ByteString message;
    UA_StatusCode retval = conn->getSendBuffer(conn, conn->remoteConf.recvBufferSize, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Jump over the messageHeader that will be encoded last */
    size_t offset = 12;

    /* Encode the Asymmetric Security Header */
    UA_AsymmetricAlgorithmSecurityHeader asymHeader;
    UA_AsymmetricAlgorithmSecurityHeader_init(&asymHeader);
    asymHeader.securityPolicyUri = UA_STRING("http://opcfoundation.org/UA/SecurityPolicy#None");
    retval = UA_AsymmetricAlgorithmSecurityHeader_encodeBinary(&asymHeader, &message, &offset);

    /* Encode the sequence header */
    UA_SequenceHeader seqHeader;
    seqHeader.sequenceNumber = ++client->channel.sendSequenceNumber;
    seqHeader.requestId = ++client->requestId;
    retval |= UA_SequenceHeader_encodeBinary(&seqHeader, &message, &offset);

    /* Encode the NodeId of the OpenSecureChannel Service */
    UA_NodeId requestType =
        UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_OPENSECURECHANNELREQUEST].binaryEncodingId);
    retval |= UA_NodeId_encodeBinary(&requestType, &message, &offset);

    /* Encode the OpenSecureChannelRequest */
    UA_OpenSecureChannelRequest opnSecRq;
    UA_OpenSecureChannelRequest_init(&opnSecRq);
    opnSecRq.requestHeader.timestamp = UA_DateTime_now();
    opnSecRq.requestHeader.authenticationToken = client->authenticationToken;
    if(renew) {
        opnSecRq.requestType = UA_SECURITYTOKENREQUESTTYPE_RENEW;
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                     "Requesting to renew the SecureChannel");
    } else {
        opnSecRq.requestType = UA_SECURITYTOKENREQUESTTYPE_ISSUE;
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                     "Requesting to open a SecureChannel");
    }
    opnSecRq.securityMode = UA_MESSAGESECURITYMODE_NONE;
    opnSecRq.clientNonce = client->channel.clientNonce;
    opnSecRq.requestedLifetime = client->config.secureChannelLifeTime;
    retval |= UA_OpenSecureChannelRequest_encodeBinary(&opnSecRq, &message, &offset);

    /* Encode the message header at the beginning */
    UA_SecureConversationMessageHeader messageHeader;
    messageHeader.messageHeader.messageTypeAndChunkType = UA_MESSAGETYPE_OPN + UA_CHUNKTYPE_FINAL;
    messageHeader.messageHeader.messageSize = (UA_UInt32)offset;
    if(renew)
        messageHeader.secureChannelId = client->channel.securityToken.channelId;
    else
        messageHeader.secureChannelId = 0;
    offset = 0;
    retval |= UA_SecureConversationMessageHeader_encodeBinary(&messageHeader, &message, &offset);

    /* Clean up and return if encoding the message failed */
    if(retval != UA_STATUSCODE_GOOD) {
        client->connection.releaseSendBuffer(&client->connection, &message);
        return retval;
    }

    /* Send the message */
    message.length = messageHeader.messageHeader.messageSize;
    retval = conn->send(conn, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Receive the response */
    UA_ByteString reply = UA_BYTESTRING_NULL;
    UA_Boolean realloced = false;
    retval = UA_Connection_receiveChunksBlocking(conn, &reply, &realloced,
                                                 client->config.timeout);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                     "Receiving OpenSecureChannelResponse failed");
        return retval;
    }

    /* Decode the header */
    offset = 0;
    retval = UA_SecureConversationMessageHeader_decodeBinary(&reply, &offset, &messageHeader);
    retval |= UA_AsymmetricAlgorithmSecurityHeader_decodeBinary(&reply, &offset, &asymHeader);
    retval |= UA_SequenceHeader_decodeBinary(&reply, &offset, &seqHeader);
    retval |= UA_NodeId_decodeBinary(&reply, &offset, &requestType);
    UA_NodeId expectedRequest =
        UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_OPENSECURECHANNELRESPONSE].binaryEncodingId);
    if(retval != UA_STATUSCODE_GOOD || !UA_NodeId_equal(&requestType, &expectedRequest)) {
        UA_ByteString_deleteMembers(&reply);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        UA_NodeId_deleteMembers(&requestType);
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Reply answers the wrong request. Expected OpenSecureChannelResponse.");
        return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Save the sequence number from server */
    client->channel.receiveSequenceNumber = seqHeader.sequenceNumber;

    /* Decode the response */
    UA_OpenSecureChannelResponse response;
    retval = UA_OpenSecureChannelResponse_decodeBinary(&reply, &offset, &response);

    /* Free the message */
    if(!realloced)
        conn->releaseRecvBuffer(conn, &reply);
    else
        UA_ByteString_deleteMembers(&reply);

    /* Results in either the StatusCode of decoding or the service */
    retval |= response.responseHeader.serviceResult;

    if(retval == UA_STATUSCODE_GOOD) {
        /* Response.securityToken.revisedLifetime is UInt32 we need to cast it
         * to DateTime=Int64 we take 75% of lifetime to start renewing as
         *  described in standard */
        client->nextChannelRenewal = UA_DateTime_nowMonotonic() +
            (UA_DateTime)(response.securityToken.revisedLifetime * (UA_Double)UA_MSEC_TO_DATETIME * 0.75);

        /* Replace the old nonce */
        UA_ChannelSecurityToken_deleteMembers(&client->channel.securityToken);
        UA_ChannelSecurityToken_copy(&response.securityToken, &client->channel.securityToken);
        UA_ByteString_deleteMembers(&client->channel.serverNonce);
        UA_ByteString_copy(&response.serverNonce, &client->channel.serverNonce);

        if(renew)
            UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                         "SecureChannel renewed");
        else
            UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                         "SecureChannel opened");
    } else {
        if(renew)
            UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                        "SecureChannel could not be renewed "
                        "with error code %s", UA_StatusCode_name(retval));
        else
            UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                        "SecureChannel could not be opened "
                        "with error code %s", UA_StatusCode_name(retval));
    }

    /* Clean up */
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
    UA_OpenSecureChannelResponse_deleteMembers(&response);
    return retval;
}